

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O1

string * __thiscall
yactfr::internal::EndReadScopeInstr::_toStr_abi_cxx11_
          (string *__return_storage_ptr__,EndReadScopeInstr *this,Size param_1)

{
  ostream *poVar1;
  Scope scope;
  string rProp;
  ostringstream ss;
  char *local_200;
  long local_1f8;
  char local_1f0;
  undefined7 uStack_1ef;
  long *local_1e0 [2];
  long local_1d0 [2];
  string local_1c0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," ",1);
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"scope","");
  local_1f8 = 0;
  local_1f0 = '\0';
  local_200 = &local_1f0;
  std::__cxx11::string::_M_replace((ulong)&local_200,0,(char *)0x0,0x2abc22);
  std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_1e0[0]);
  std::__cxx11::string::append((char *)&local_200);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_200,local_1f8);
  (anonymous_namespace)::scopeStr_abi_cxx11_
            (&local_1c0,(_anonymous_namespace_ *)(ulong)*(uint *)&(this->super_Instr).field_0xc,
             scope);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,CONCAT71(uStack_1ef,local_1f0) + 1);
  }
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string EndReadScopeInstr::_toStr(Size) const
{
    std::ostringstream ss;

    ss << " " << _strProp("scope") << scopeStr(_scope) << std::endl;
    return ss.str();
}